

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O1

char * hy36encode(uint width,int value,char *result)

{
  int value_00;
  uint width_00;
  char *pcVar1;
  
  if (width == 0) {
LAB_00123759:
    *result = '\0';
    pcVar1 = "unsupported width.";
  }
  else {
    if (width == 5) {
      if (-10000 < value) {
        if (value < 100000) {
          width_00 = 5;
LAB_00123733:
          encode_pure("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ",10,width_00,value,result);
          return (char *)0x0;
        }
        if (value < 0x29be0a0) {
          value_00 = value + 0xfec360;
LAB_00123786:
          pcVar1 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
LAB_001237b4:
          encode_pure(pcVar1,0x24,0,value_00,result);
          return (char *)0x0;
        }
        if (value < 0x5363aa0) {
          value_00 = value + -0x19b96a0;
LAB_001237ad:
          pcVar1 = "0123456789abcdefghijklmnopqrstuvwxyz";
          goto LAB_001237b4;
        }
      }
    }
    else {
      if (width != 4) {
        memset(result,0x2a,(ulong)width);
        result = result + width;
        goto LAB_00123759;
      }
      if (-1000 < value) {
        if (value < 10000) {
          width_00 = 4;
          goto LAB_00123733;
        }
        if (value < 0x12a990) {
          value_00 = value + 0x6f770;
          goto LAB_00123786;
        }
        if (value < 0x252c10) {
          value_00 = value + -0xb8b10;
          goto LAB_001237ad;
        }
      }
    }
    if (width != 0) {
      memset(result,0x2a,(ulong)width);
      result = result + width;
    }
    *result = '\0';
    pcVar1 = "value out of range.";
  }
  return pcVar1;
}

Assistant:

const char*
hy36encode(unsigned width, int value, char* result)
{
  int i = value;
  if (width == 4U) {
    if (i >= -999) {
      if (i < 10000) {
        encode_pure(digits_upper(), 10U, 4U, i, result);
        return 0;
      }
      i -= 10000;
      if (i < 1213056 /* 26*36**3 */) {
        i += 466560 /* 10*36**3 */;
        encode_pure(digits_upper(), 36U, 0U, i, result);
        return 0;
      }
      i -= 1213056;
      if (i < 1213056) {
        i += 466560;
        encode_pure(digits_lower(), 36U, 0U, i, result);
        return 0;
      }
    }
  }
  else if (width == 5U) {
    if (i >= -9999) {
      if (i < 100000) {
        encode_pure(digits_upper(), 10U, 5U, i, result);
        return 0;
      }
      i -= 100000;
      if (i < 43670016 /* 26*36**4 */) {
        i += 16796160 /* 10*36**4 */;
        encode_pure(digits_upper(), 36U, 0U, i, result);
        return 0;
      }
      i -= 43670016;
      if (i < 43670016) {
        i += 16796160;
        encode_pure(digits_lower(), 36U, 0U, i, result);
        return 0;
      }
    }
  }
  else {
    fill_with_stars(width, result);
    return unsupported_width();
  }
  fill_with_stars(width, result);
  return value_out_of_range();
}